

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall lumeview::Renderer::render(Renderer *this,View *view)

{
  bool bVar1;
  undefined1 local_48 [8];
  Shader shader;
  Stage *stage;
  iterator __end1;
  iterator __begin1;
  vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_> *__range1;
  View *view_local;
  Renderer *this_local;
  
  prepare_buffers(this);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glDepthFunc)(0x203);
  __end1 = std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::begin
                     (&this->m_stages);
  stage = (Stage *)std::
                   vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>::
                   end(&this->m_stages);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<lumeview::Renderer::Stage_*,_std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>_>
                                *)&stage);
    if (!bVar1) break;
    shader.m_shaderData.super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<lumeview::Renderer::Stage_*,_std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>_>
         ::operator*(&__end1);
    get_shader((Renderer *)local_48,(GrobSet)(index_t)this,
               (((reference)
                shader.m_shaderData.
                super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->grobSet).m_offset);
    View::apply(view);
    Shader::use((Shader *)local_48);
    Shader::set_view((Shader *)local_48,view);
    Shader::set_uniform((Shader *)local_48,"color",
                        (vec4 *)((long)&shader.m_shaderData.
                                        super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi[3]._vptr__Sp_counted_base + 4));
    Shader::set_uniform((Shader *)local_48,"zfacNear",
                        *(float *)((long)&shader.m_shaderData.
                                          super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi[4]._vptr__Sp_counted_base + 4));
    Shader::set_uniform((Shader *)local_48,"zfacFar",
                        (float)shader.m_shaderData.
                               super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi[4]._M_use_count);
    (*glad_glBindVertexArray)
              (shader.m_shaderData.
               super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[4]._M_weak_count);
    (*glad_glDrawElements)
              (*(GLenum *)
                &shader.m_shaderData.
                 super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[8]._vptr__Sp_counted_base,
               *(GLsizei *)
                ((long)&shader.m_shaderData.
                        super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi[8]._vptr__Sp_counted_base + 4),0x1405,(void *)0x0);
    Shader::~Shader((Shader *)local_48);
    __gnu_cxx::
    __normal_iterator<lumeview::Renderer::Stage_*,_std::vector<lumeview::Renderer::Stage,_std::allocator<lumeview::Renderer::Stage>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Renderer::
render (const View& view)
{
	prepare_buffers ();

	glEnable (GL_BLEND);
	glBlendFunc (GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	glDepthFunc(GL_LEQUAL);

	for(auto& stage : m_stages) {
		Shader shader = get_shader (stage.grobSet, stage.shadingPreset);
		view.apply ();
		shader.use ();
		shader.set_view (view);
		shader.set_uniform("color", stage.color);
		shader.set_uniform("zfacNear", stage.zfacNear);
		shader.set_uniform("zfacFar", stage.zfacFar);
		glBindVertexArray (stage.vao);
		glDrawElements (stage.primType, stage.numInds, GL_UNSIGNED_INT, 0);
	}
}